

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QXdgDesktopPortalFileDialog::Filter>::Inserter::insert
          (Inserter *this,qsizetype pos,Filter *t,qsizetype n)

{
  QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition> *this_00;
  undefined8 *puVar1;
  Filter *pFVar2;
  Data *pDVar3;
  Data *pDVar4;
  undefined8 uVar5;
  long lVar6;
  qsizetype qVar7;
  undefined8 uVar8;
  FilterCondition *pFVar9;
  FilterCondition *pFVar10;
  qsizetype i;
  long lVar11;
  long lVar12;
  undefined8 *puVar13;
  
  pFVar2 = this->begin;
  lVar11 = this->size;
  this->end = pFVar2 + lVar11;
  this->last = pFVar2 + lVar11 + -1;
  this->where = pFVar2 + pos;
  lVar11 = lVar11 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = n;
  lVar12 = n - lVar11;
  this->move = lVar12;
  this->sourceCopyAssign = n;
  if (lVar12 == 0 || n < lVar11) {
    lVar11 = 0;
  }
  else {
    this->sourceCopyConstruct = lVar12;
    this->move = 0;
    this->sourceCopyAssign = lVar11;
    lVar12 = 0x28;
    lVar11 = 0;
    do {
      pFVar2 = this->end;
      pDVar3 = (t->name).d.d;
      *(Data **)((long)pFVar2 + lVar12 + -0x28) = pDVar3;
      *(char16_t **)((long)pFVar2 + lVar12 + -0x20) = (t->name).d.ptr;
      *(qsizetype *)((long)pFVar2 + lVar12 + -0x18) = (t->name).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar4 = (t->filterConditions).d.d;
      *(Data **)((long)pFVar2 + lVar12 + -0x10) = pDVar4;
      *(FilterCondition **)((long)pFVar2 + lVar12 + -8) = (t->filterConditions).d.ptr;
      *(qsizetype *)((long)&(pFVar2->name).d.d + lVar12) = (t->filterConditions).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      this->size = this->size + 1;
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0x30;
    } while (lVar11 != this->sourceCopyConstruct);
    n = this->nSource;
  }
  if (lVar11 != n) {
    lVar12 = lVar11 * 0x30 + 0x18;
    do {
      pFVar2 = this->end;
      puVar13 = (undefined8 *)((long)&pFVar2[-n].name.d.d + lVar12);
      uVar5 = puVar13[-3];
      uVar8 = puVar13[-2];
      puVar13[-3] = 0;
      puVar13[-2] = 0;
      puVar1 = (undefined8 *)((long)pFVar2 + lVar12 + -0x18);
      *puVar1 = uVar5;
      puVar1[1] = uVar8;
      uVar5 = puVar13[-1];
      puVar13[-1] = 0;
      *(undefined8 *)((long)pFVar2 + lVar12 + -8) = uVar5;
      uVar5 = *puVar13;
      uVar8 = puVar13[1];
      *puVar13 = 0;
      puVar13[1] = 0;
      puVar1 = (undefined8 *)((long)&(pFVar2->name).d.d + lVar12);
      *puVar1 = uVar5;
      puVar1[1] = uVar8;
      uVar5 = puVar13[2];
      puVar13[2] = 0;
      *(undefined8 *)((long)&(pFVar2->name).d.size + lVar12) = uVar5;
      this->size = this->size + 1;
      lVar11 = lVar11 + 1;
      n = this->nSource;
      lVar12 = lVar12 + 0x30;
    } while (lVar11 != n);
  }
  if (this->move != 0) {
    lVar12 = 0x18;
    lVar11 = 0;
    do {
      lVar6 = this->nSource;
      pFVar2 = this->last;
      this_00 = (QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition> *)
                ((long)&(pFVar2->name).d.d + lVar12);
      puVar1 = (undefined8 *)((long)pFVar2 + lVar12 + -0x18);
      pDVar4 = (Data *)*puVar1;
      pFVar9 = (FilterCondition *)puVar1[1];
      pFVar10 = this_00[lVar6 * -2 + -1].ptr;
      puVar1 = (undefined8 *)((long)pFVar2 + lVar12 + -0x18);
      *puVar1 = this_00[lVar6 * -2 + -1].d;
      puVar1[1] = pFVar10;
      this_00[lVar6 * -2 + -1].d = pDVar4;
      this_00[lVar6 * -2 + -1].ptr = pFVar9;
      qVar7 = *(qsizetype *)((long)pFVar2 + lVar12 + -8);
      *(qsizetype *)((long)pFVar2 + lVar12 + -8) = this_00[lVar6 * -2 + -1].size;
      this_00[lVar6 * -2 + -1].size = qVar7;
      QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>::operator=
                (this_00,(QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition> *)
                         ((long)&pFVar2[-lVar6].name.d.d + lVar12));
      lVar11 = lVar11 + -1;
      lVar12 = lVar12 + -0x30;
    } while (lVar11 != this->move);
  }
  if (this->sourceCopyAssign != 0) {
    lVar12 = 0x18;
    lVar11 = 0;
    do {
      pFVar2 = this->where;
      QString::operator=((QString *)((long)pFVar2 + lVar12 + -0x18),&t->name);
      QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>::operator=
                ((QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition> *)
                 ((long)&(pFVar2->name).d.d + lVar12),&(t->filterConditions).d);
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0x30;
    } while (lVar11 != this->sourceCopyAssign);
  }
  return;
}

Assistant:

void insert(qsizetype pos, const T &t, qsizetype n)
        {
            const qsizetype oldSize = size;
            Q_UNUSED(oldSize);

            setup(pos, n);

            // first create new elements at the end, by copying from elements
            // to be inserted (if they extend past the current end of the array)
            for (qsizetype i = 0; i != sourceCopyConstruct; ++i) {
                new (end + i) T(t);
                ++size;
            }
            Q_ASSERT(size <= oldSize + n);

            // now move construct new elements at the end from existing elements inside
            // the array.
            for (qsizetype i = sourceCopyConstruct; i != nSource; ++i) {
                new (end + i) T(std::move(*(end + i - nSource)));
                ++size;
            }
            // array has the new size now!
            Q_ASSERT(size == oldSize + n);

            // now move assign existing elements towards the end
            for (qsizetype i = 0; i != move; --i)
                last[i] = std::move(last[i - nSource]);

            // finally copy the remaining elements from source over
            for (qsizetype i = 0; i != sourceCopyAssign; ++i)
                where[i] = t;
        }